

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

int __thiscall ON_String::Replace(ON_String *this,char *token1,char *token2)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  ON_Internal_Empty_aString *pOVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int len;
  int i;
  ON_SimpleArray<int> n;
  uint local_74;
  int local_70;
  uint local_6c;
  size_t local_68;
  ulong local_60;
  size_t local_58;
  char *local_50;
  ON_SimpleArray<int> local_48;
  
  iVar11 = 0;
  if ((token1 != (char *)0x0) && (*token1 != '\0')) {
    pcVar9 = "";
    if (token2 != (char *)0x0) {
      pcVar9 = token2;
    }
    sVar4 = strlen(token1);
    uVar8 = (uint)sVar4;
    iVar11 = 0;
    if (0 < (int)uVar8) {
      local_58 = strlen(pcVar9);
      pOVar5 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      if (this->m_s == (char *)0x0) {
        pOVar5 = &empty_astring;
      }
      local_74 = (pOVar5->header).string_length;
      iVar11 = 0;
      if ((int)uVar8 <= (int)local_74) {
        local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
        local_48.m_a = (int *)0x0;
        local_48.m_count = 0;
        local_48.m_capacity = 0;
        local_50 = pcVar9;
        ON_SimpleArray<int>::SetCapacity(&local_48,0x20);
        pcVar9 = this->m_s;
        local_70 = 0;
        if ((int)uVar8 <= (int)local_74) {
          do {
            iVar11 = local_70;
            iVar3 = strncmp(pcVar9,token1,(ulong)(uVar8 & 0x7fffffff));
            if (iVar3 == 0) {
              ON_SimpleArray<int>::Append(&local_48,&local_70);
              local_70 = local_70 + uVar8;
              pcVar9 = pcVar9 + (uVar8 & 0x7fffffff);
            }
            else {
              pcVar9 = pcVar9 + 1;
              local_70 = iVar11 + 1;
            }
          } while (local_70 <= (int)(local_74 - uVar8));
        }
        sVar4 = local_58;
        iVar11 = local_48.m_count;
        uVar10 = local_48._16_8_ & 0xffffffff;
        uVar12 = (uint)local_58;
        uVar7 = (uVar12 - uVar8) * local_48.m_count + local_74;
        if (uVar7 == 0) {
          Destroy(this);
        }
        else {
          CopyArray(this);
          uVar13 = local_74;
          if ((int)local_74 < (int)uVar7) {
            uVar13 = uVar7;
          }
          ReserveArray(this,(long)(int)uVar13);
          local_6c = uVar7;
          local_60 = uVar10;
          if ((int)uVar8 < (int)uVar12) {
            if (0 < iVar11) {
              uVar6 = 0;
              do {
                local_48.m_a[uVar6] = local_48.m_a[uVar6] + uVar8;
                uVar6 = uVar6 + 1;
              } while (uVar10 != uVar6);
            }
            if (0 < iVar11) {
              local_68 = sVar4 & 0xffffffff;
              uVar12 = local_74;
              do {
                uVar14 = (ulong)uVar12;
                uVar6 = (ulong)uVar7;
                uVar13 = local_48.m_a[uVar10 - 1];
                if ((int)uVar13 < (int)uVar12) {
                  uVar6 = (ulong)(int)uVar7;
                  uVar14 = (ulong)(int)uVar12;
                  do {
                    lVar2 = uVar14 - 1;
                    uVar14 = uVar14 - 1;
                    this->m_s[uVar6 - 1] = this->m_s[lVar2];
                    uVar6 = uVar6 - 1;
                  } while ((long)(int)uVar13 < (long)uVar14);
                }
                uVar7 = (int)uVar6 - (int)local_58;
                uVar12 = (int)uVar14 - uVar8;
                memcpy(this->m_s + (int)uVar7,local_50,local_68);
                bVar1 = 1 < (long)uVar10;
                uVar10 = uVar10 - 1;
              } while (bVar1);
            }
          }
          else {
            uVar7 = *local_48.m_a;
            uVar10 = (ulong)uVar7;
            ON_SimpleArray<int>::Append(&local_48,(int *)&local_74);
            if (0 < iVar11) {
              local_68 = (size_t)(uVar12 & 0x7fffffff);
              uVar6 = 0;
              uVar14 = (ulong)uVar7;
              do {
                if (0 < (int)uVar12) {
                  memcpy(this->m_s + (int)uVar10,local_50,local_68);
                  uVar10 = (ulong)((int)uVar10 + uVar12);
                }
                uVar13 = (int)uVar14 + uVar8;
                uVar14 = (ulong)uVar13;
                uVar7 = local_48.m_a[uVar6 + 1];
                if ((int)uVar13 < (int)uVar7) {
                  uVar10 = (ulong)(int)uVar10;
                  uVar14 = (ulong)(int)uVar13;
                  do {
                    pcVar9 = this->m_s + uVar14;
                    uVar14 = uVar14 + 1;
                    this->m_s[uVar10] = *pcVar9;
                    uVar10 = uVar10 + 1;
                  } while ((long)uVar14 < (long)(int)uVar7);
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 != local_60);
            }
          }
          pcVar9 = this->m_s;
          pOVar5 = (ON_Internal_Empty_aString *)(pcVar9 + -0xc);
          if (pcVar9 == (char *)0x0) {
            pOVar5 = &empty_astring;
          }
          (pOVar5->header).string_length = local_6c;
          pcVar9[(int)local_6c] = '\0';
          iVar11 = (int)local_60;
        }
        ON_SimpleArray<int>::~ON_SimpleArray(&local_48);
      }
    }
  }
  return iVar11;
}

Assistant:

int ON_String::Replace( const char* token1, const char* token2 )
{
  int count = 0;

  if ( 0 != token1 && 0 != token1[0] )
  {
    if ( 0 == token2 )
      token2 = "";
    const int len1 = (int)strlen(token1);
    if ( len1 > 0 )
    {
      const int len2 = (int)strlen(token2);
      int len = Length();
      if ( len >= len1 )
      {
        // in-place
        ON_SimpleArray<int> n(32);
        const char* s = m_s;
        int i;
        for ( i = 0; i <= len-len1; /*empty*/ )
        {
          if ( strncmp(s,token1,len1) )
          {
            s++;
            i++;
          }
          else
          {
            n.Append(i);
            i += len1;
            s += len1;
          }
        }

        count = n.Count();

        // reserve array space - must be done even when len2 <= len1
        // so that shared arrays are not corrupted.
        const int newlen = len + (count*(len2-len1));
        if ( 0 == newlen )
        {
          Destroy();
          return count;
        }

        CopyArray();

        // 24 August 2006 Dale Lear
        //    This used to say
        //       ReserveArray(newlen);
        //    but when newlen < len and the string had multiple
        //    references, the ReserveArray(newlen) call truncated
        //    the input array.  
        ReserveArray( ((newlen<len) ? len : newlen) );

        int i0, i1, ni, j;

        if ( len2 > len1 )
        {
          // copy from back to front
          i1 = newlen;
          i0 = len;
          for ( ni =0; ni < count; ni++ )
            n[ni] = n[ni] + len1;
          for ( ni = count-1; ni >= 0; ni-- )
          {
            j = n[ni];
            while ( i0 > j )
            {
              i0--;
              i1--;
              m_s[i1] = m_s[i0];
            }
            i1 -= len2;
            i0 -= len1;
            memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
          }
        }
        else
        {
          // copy from front to back
          i0 = i1 = n[0];
          n.Append(len);
          for ( ni = 0; ni < count; ni++ )
          {
            if ( len2 > 0 )
            {
              memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
              i1 += len2;
            }
            i0 += len1;
            j = n[ni+1];
            while ( i0 < j )
            {
              m_s[i1++] = m_s[i0++];
            }
          }
        }
        Header()->string_length = newlen;
        m_s[newlen] = 0;
      }
    }
  }

  return count;
}